

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O2

string * __thiscall
gl3cts::TextureSwizzle::SmokeTest::prepareArguments_abi_cxx11_
          (string *__return_storage_ptr__,SmokeTest *this,testCase *test_case)

{
  size_t sVar1;
  long lVar2;
  char *pcVar3;
  SmokeTest *this_00;
  SmokeTest *this_01;
  SmokeTest *pSVar4;
  long lVar5;
  size_t position;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = (SmokeTest *)&position;
  this_01 = (SmokeTest *)&position;
  pSVar4 = (SmokeTest *)&position;
  lVar5 = test_case->m_texture_access_index * 0x18;
  lVar2 = test_case->m_source_texture_target_index * 0x30;
  pcVar3 = "COORDINATESLODDERIVATIVESOFFSETSSAMPLE";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"COORDINATESLODDERIVATIVESOFFSETSSAMPLE",
             (allocator<char> *)&local_70);
  prepareCoordinates_abi_cxx11_(&local_70,(SmokeTest *)pcVar3,test_case);
  position = 0;
  Utils::replaceToken("COORDINATES",&position,local_70._M_dataplus._M_p,__return_storage_ptr__);
  if ((texture_access[lVar5 + 0x12] == '\x01') && (texture_targets[lVar2 + 0x21] != '\0')) {
    pcVar3 = ", int(0)";
  }
  else {
    if (texture_access[lVar5 + 0x10] == '\x01') {
      prepareDerivatives_abi_cxx11_(&local_90,this_00,test_case,0);
      prepareDerivatives_abi_cxx11_(&local_50,this_00,test_case,1);
      sVar1 = position;
      Utils::replaceToken("LODDERIVATIVES",&position,", XXXXX, XXXXX",__return_storage_ptr__);
      position = sVar1 + 2;
      Utils::replaceToken("XXXXX",&position,local_90._M_dataplus._M_p,__return_storage_ptr__);
      Utils::replaceToken("XXXXX",&position,local_50._M_dataplus._M_p,__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_90);
      goto LAB_0092860e;
    }
    pcVar3 = "";
  }
  Utils::replaceToken("LODDERIVATIVES",&position,pcVar3,__return_storage_ptr__);
  this_01 = pSVar4;
LAB_0092860e:
  if (texture_access[lVar5 + 0x13] == '\x01') {
    prepareOffsets_abi_cxx11_(&local_90,this_01,test_case);
    sVar1 = position;
    Utils::replaceToken("OFFSETS",&position,", XXXXX",__return_storage_ptr__);
    position = sVar1 + 2;
    Utils::replaceToken("XXXXX",&position,local_90._M_dataplus._M_p,__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_90);
  }
  else {
    Utils::replaceToken("OFFSETS",&position,"",__return_storage_ptr__);
  }
  if ((texture_targets[lVar2 + 0x24] == '\x01') && (texture_access[lVar5 + 0x14] == '\x01')) {
    prepareSample_abi_cxx11_(&local_90,this);
    sVar1 = position;
    Utils::replaceToken("SAMPLE",&position,", XX",__return_storage_ptr__);
    position = sVar1 + 2;
    Utils::replaceToken("XX",&position,local_90._M_dataplus._M_p,__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_90);
  }
  else {
    Utils::replaceToken("SAMPLE",&position,"",__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string SmokeTest::prepareArguments(const testCase& test_case)
{
	const _texture_access& access = texture_access[test_case.m_texture_access_index];
	const _texture_target& target = texture_targets[test_case.m_source_texture_target_index];

	std::string		   arguments   = "COORDINATESLODDERIVATIVESOFFSETSSAMPLE";
	const std::string& coordinates = prepareCoordinates(test_case);

	size_t position = 0;

	Utils::replaceToken("COORDINATES", position, coordinates.c_str(), arguments);

	if ((true == access.m_use_lod) && (true == target.m_support_lod))
	{
		Utils::replaceToken("LODDERIVATIVES", position, ", int(0)", arguments);
	}
	else if (true == access.m_use_derivaties)
	{
		const std::string& derivatives_0 = prepareDerivatives(test_case, 0);
		const std::string& derivatives_1 = prepareDerivatives(test_case, 1);
		const size_t	   start_pos	 = position;

		Utils::replaceToken("LODDERIVATIVES", position, ", XXXXX, XXXXX", arguments);
		position = start_pos + 2;
		Utils::replaceToken("XXXXX", position, derivatives_0.c_str(), arguments);
		Utils::replaceToken("XXXXX", position, derivatives_1.c_str(), arguments);
	}
	else
	{
		Utils::replaceToken("LODDERIVATIVES", position, "", arguments);
	}

	if (true == access.m_use_offsets)
	{
		const std::string& offsets   = prepareOffsets(test_case);
		const size_t	   start_pos = position;

		Utils::replaceToken("OFFSETS", position, ", XXXXX", arguments);
		position = start_pos + 2;
		Utils::replaceToken("XXXXX", position, offsets.c_str(), arguments);
	}
	else
	{
		Utils::replaceToken("OFFSETS", position, "", arguments);
	}

	if ((true == target.m_require_multisampling) && (true == access.m_support_multisampling))
	{
		const std::string& sample	= prepareSample();
		const size_t	   start_pos = position;

		Utils::replaceToken("SAMPLE", position, ", XX", arguments);
		position = start_pos + 2;
		Utils::replaceToken("XX", position, sample.c_str(), arguments);
	}
	else
	{
		Utils::replaceToken("SAMPLE", position, "", arguments);
	}

	return arguments;
}